

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompareDump.cpp
# Opt level: O2

aiString * __thiscall
comparer_context::cmp<aiString>
          (aiString *__return_storage_ptr__,comparer_context *this,string *name)

{
  bool bVar1;
  ostream *poVar2;
  basic_ostream<char,_std::char_traits<char>_> *pbVar3;
  string sStack_5d8;
  stringstream ss;
  ostream local_5a8 [380];
  aiString e;
  
  __return_storage_ptr__->length = 0;
  __return_storage_ptr__->data[0] = '\0';
  memset(__return_storage_ptr__->data + 1,0x1b,0x3ff);
  e.length = 0;
  e.data[0] = '\0';
  memset(e.data + 1,0x1b,0x3ff);
  read<aiString>(this,__return_storage_ptr__,&e);
  bVar1 = aiString::operator!=(__return_storage_ptr__,&e);
  if (!bVar1) {
    return __return_storage_ptr__;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar2 = std::operator<<(local_5a8,"Expected ");
  pbVar3 = ::operator<<(poVar2,&e);
  poVar2 = std::operator<<(pbVar3,", but actual is ");
  ::operator<<(poVar2,__return_storage_ptr__);
  std::__cxx11::stringbuf::str();
  failure(this,&sStack_5d8,name);
}

Assistant:

T cmp(const std::string& name) {
        T a,e;
        read(a,e);

        if(a != e) {
            std::stringstream ss;
            failure((ss<< "Expected " << e << ", but actual is " << a,
                ss.str()),name);
        }
    //  std::cout << name << " " << std::hex << a << std::endl;
        return a;
    }